

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,comment *note)

{
  bool local_bc;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [55];
  byte local_61;
  string local_60 [32];
  string local_40 [32];
  comment *local_20;
  comment *note_local;
  ostream *os_local;
  
  local_20 = note;
  note_local = (comment *)os;
  local_bc = comment::operator_cast_to_bool(note);
  local_61 = 0;
  if (local_bc) {
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aebe3);
    local_61 = 1;
    std::__cxx11::string::string(local_40,local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"",&local_b9);
    std::__cxx11::string::string(local_98,local_b8);
    std::__cxx11::string::string(local_40,local_98);
  }
  local_bc = !local_bc;
  os_local = std::operator<<(os,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_bc) {
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string(local_60);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}